

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O0

void __thiscall
VectorsTest_Int3Greater_Test::VectorsTest_Int3Greater_Test(VectorsTest_Int3Greater_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__VectorsTest_Int3Greater_Test_002abe70;
  return;
}

Assistant:

TEST(VectorsTest, Int3Greater)
{
    Int3 v1(13, 25, 21), v2(6, 8, 2), v3(14, 6, 1);
    ASSERT_TRUE(v1 > v2);
    ASSERT_FALSE(v2 > v1);
    ASSERT_FALSE(v1 > v3);
    ASSERT_FALSE(v3 > v1);
    ASSERT_FALSE(v2 > v3);
    ASSERT_FALSE(v3 > v2);
}